

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::PluralRules::getRuleFromResource
          (UnicodeString *__return_storage_ptr__,PluralRules *this,Locale *locale,UPluralType type,
          UErrorCode *errCode)

{
  UBool UVar1;
  int32_t iVar2;
  UResourceBundle *pUVar3;
  char *pcVar4;
  undefined1 local_310 [8];
  UnicodeString uKey;
  UnicodeString rules;
  char *pcStack_288;
  int32_t i;
  char *key;
  int32_t numberKeys;
  LocalUResourceBundlePointer setRes;
  LocalUResourceBundlePointer ruleRes;
  char setKey [256];
  char *curLocaleName2;
  char parentLocaleName [157];
  UChar *pUStack_b0;
  UErrorCode status;
  UChar *s;
  char *curLocaleName;
  int32_t resLen;
  LocalUResourceBundlePointer locRes;
  char *typeKey;
  LocalUResourceBundlePointer rb;
  undefined1 local_70 [8];
  UnicodeString emptyStr;
  UErrorCode *errCode_local;
  UPluralType type_local;
  Locale *locale_local;
  PluralRules *this_local;
  UnicodeString *result;
  
  emptyStr.fUnion._48_8_ = errCode;
  UnicodeString::UnicodeString((UnicodeString *)local_70);
  UVar1 = ::U_FAILURE(*(UErrorCode *)emptyStr.fUnion._48_8_);
  if (UVar1 != '\0') {
    UnicodeString::UnicodeString(__return_storage_ptr__,(UnicodeString *)local_70);
    rb.super_LocalPointerBase<UResourceBundle>.ptr._0_4_ = 1;
    goto LAB_00310fba;
  }
  pUVar3 = ures_openDirect_63((char *)0x0,"plurals",(UErrorCode *)emptyStr.fUnion._48_8_);
  LocalUResourceBundlePointer::LocalUResourceBundlePointer
            ((LocalUResourceBundlePointer *)&typeKey,pUVar3);
  UVar1 = ::U_FAILURE(*(UErrorCode *)emptyStr.fUnion._48_8_);
  if (UVar1 == '\0') {
    if (type == UPLURAL_TYPE_CARDINAL) {
      locRes.super_LocalPointerBase<UResourceBundle>.ptr =
           (LocalPointerBase<UResourceBundle>)anon_var_dwarf_17d348;
    }
    else {
      if (type != UPLURAL_TYPE_ORDINAL) {
        *(undefined4 *)emptyStr.fUnion._48_8_ = 1;
        UnicodeString::UnicodeString(__return_storage_ptr__,(UnicodeString *)local_70);
        rb.super_LocalPointerBase<UResourceBundle>.ptr._0_4_ = 1;
        goto LAB_00310fa4;
      }
      locRes.super_LocalPointerBase<UResourceBundle>.ptr =
           (LocalPointerBase<UResourceBundle>)anon_var_dwarf_17d353;
    }
    pUVar3 = LocalPointerBase<UResourceBundle>::getAlias
                       ((LocalPointerBase<UResourceBundle> *)&typeKey);
    pUVar3 = ures_getByKey_63(pUVar3,(char *)locRes.super_LocalPointerBase<UResourceBundle>.ptr,
                              (UResourceBundle *)0x0,(UErrorCode *)emptyStr.fUnion._48_8_);
    LocalUResourceBundlePointer::LocalUResourceBundlePointer
              ((LocalUResourceBundlePointer *)&stack0xffffffffffffff68,pUVar3);
    UVar1 = ::U_FAILURE(*(UErrorCode *)emptyStr.fUnion._48_8_);
    if (UVar1 == '\0') {
      curLocaleName._4_4_ = 0;
      pcVar4 = Locale::getName(locale);
      pUVar3 = LocalPointerBase<UResourceBundle>::getAlias
                         ((LocalPointerBase<UResourceBundle> *)&stack0xffffffffffffff68);
      pUStack_b0 = ures_getStringByKey_63
                             (pUVar3,pcVar4,(int32_t *)((long)&curLocaleName + 4),
                              (UErrorCode *)emptyStr.fUnion._48_8_);
      if (pUStack_b0 == (UChar *)0x0) {
        stack0xffffffffffffff4c = 0;
        pcVar4 = Locale::getName(locale);
        strcpy((char *)&curLocaleName2,pcVar4);
        while (iVar2 = uloc_getParent_63((char *)&curLocaleName2,(char *)&curLocaleName2,0x9d,
                                         (UErrorCode *)(parentLocaleName + 0x9c)), 0 < iVar2) {
          curLocaleName._4_4_ = 0;
          pUVar3 = LocalPointerBase<UResourceBundle>::getAlias
                             ((LocalPointerBase<UResourceBundle> *)&stack0xffffffffffffff68);
          pUStack_b0 = ures_getStringByKey_63
                                 (pUVar3,(char *)&curLocaleName2,
                                  (int32_t *)((long)&curLocaleName + 4),
                                  (UErrorCode *)(parentLocaleName + 0x9c));
          if (pUStack_b0 != (UChar *)0x0) {
            *(undefined4 *)emptyStr.fUnion._48_8_ = 0;
            break;
          }
          stack0xffffffffffffff4c = 0;
        }
      }
      if (pUStack_b0 == (UChar *)0x0) {
        UnicodeString::UnicodeString(__return_storage_ptr__,(UnicodeString *)local_70);
        rb.super_LocalPointerBase<UResourceBundle>.ptr._0_4_ = 1;
      }
      else {
        u_UCharsToChars_63(pUStack_b0,(char *)&ruleRes,curLocaleName._4_4_ + 1);
        pUVar3 = LocalPointerBase<UResourceBundle>::getAlias
                           ((LocalPointerBase<UResourceBundle> *)&typeKey);
        pUVar3 = ures_getByKey_63(pUVar3,"rules",(UResourceBundle *)0x0,
                                  (UErrorCode *)emptyStr.fUnion._48_8_);
        LocalUResourceBundlePointer::LocalUResourceBundlePointer(&setRes,pUVar3);
        UVar1 = ::U_FAILURE(*(UErrorCode *)emptyStr.fUnion._48_8_);
        if (UVar1 == '\0') {
          pUVar3 = LocalPointerBase<UResourceBundle>::getAlias
                             (&setRes.super_LocalPointerBase<UResourceBundle>);
          pUVar3 = ures_getByKey_63(pUVar3,(char *)&ruleRes,(UResourceBundle *)0x0,
                                    (UErrorCode *)emptyStr.fUnion._48_8_);
          LocalUResourceBundlePointer::LocalUResourceBundlePointer
                    ((LocalUResourceBundlePointer *)&stack0xfffffffffffffd88,pUVar3);
          UVar1 = ::U_FAILURE(*(UErrorCode *)emptyStr.fUnion._48_8_);
          if (UVar1 == '\0') {
            pUVar3 = LocalPointerBase<UResourceBundle>::getAlias
                               ((LocalPointerBase<UResourceBundle> *)&stack0xfffffffffffffd88);
            key._4_4_ = ures_getSize_63(pUVar3);
            key._3_1_ = 0;
            UnicodeString::UnicodeString(__return_storage_ptr__);
            pcStack_288 = (char *)0x0;
            for (rules.fUnion._52_4_ = 0; (int)rules.fUnion._52_4_ < key._4_4_;
                rules.fUnion._52_4_ = rules.fUnion._52_4_ + 1) {
              pUVar3 = LocalPointerBase<UResourceBundle>::getAlias
                                 ((LocalPointerBase<UResourceBundle> *)&stack0xfffffffffffffd88);
              ures_getNextUnicodeString
                        ((UnicodeString *)((long)&uKey.fUnion + 0x30),pUVar3,
                         &stack0xfffffffffffffd78,(UErrorCode *)emptyStr.fUnion._48_8_);
              UnicodeString::UnicodeString((UnicodeString *)local_310,pcStack_288,-1,kInvariant);
              UnicodeString::append(__return_storage_ptr__,(UnicodeString *)local_310);
              UnicodeString::append(__return_storage_ptr__,L':');
              UnicodeString::append
                        (__return_storage_ptr__,(UnicodeString *)((long)&uKey.fUnion + 0x30));
              UnicodeString::append(__return_storage_ptr__,L';');
              UnicodeString::~UnicodeString((UnicodeString *)local_310);
              UnicodeString::~UnicodeString((UnicodeString *)((long)&uKey.fUnion + 0x30));
            }
            key._3_1_ = 1;
          }
          else {
            UnicodeString::UnicodeString(__return_storage_ptr__,(UnicodeString *)local_70);
          }
          rb.super_LocalPointerBase<UResourceBundle>.ptr._0_4_ = 1;
          LocalUResourceBundlePointer::~LocalUResourceBundlePointer
                    ((LocalUResourceBundlePointer *)&stack0xfffffffffffffd88);
        }
        else {
          UnicodeString::UnicodeString(__return_storage_ptr__,(UnicodeString *)local_70);
          rb.super_LocalPointerBase<UResourceBundle>.ptr._0_4_ = 1;
        }
        LocalUResourceBundlePointer::~LocalUResourceBundlePointer(&setRes);
      }
    }
    else {
      UnicodeString::UnicodeString(__return_storage_ptr__,(UnicodeString *)local_70);
      rb.super_LocalPointerBase<UResourceBundle>.ptr._0_4_ = 1;
    }
    LocalUResourceBundlePointer::~LocalUResourceBundlePointer
              ((LocalUResourceBundlePointer *)&stack0xffffffffffffff68);
  }
  else {
    UnicodeString::UnicodeString(__return_storage_ptr__,(UnicodeString *)local_70);
    rb.super_LocalPointerBase<UResourceBundle>.ptr._0_4_ = 1;
  }
LAB_00310fa4:
  LocalUResourceBundlePointer::~LocalUResourceBundlePointer((LocalUResourceBundlePointer *)&typeKey)
  ;
LAB_00310fba:
  UnicodeString::~UnicodeString((UnicodeString *)local_70);
  return __return_storage_ptr__;
}

Assistant:

UnicodeString
PluralRules::getRuleFromResource(const Locale& locale, UPluralType type, UErrorCode& errCode) {
    UnicodeString emptyStr;

    if (U_FAILURE(errCode)) {
        return emptyStr;
    }
    LocalUResourceBundlePointer rb(ures_openDirect(nullptr, "plurals", &errCode));
    if(U_FAILURE(errCode)) {
        return emptyStr;
    }
    const char *typeKey;
    switch (type) {
    case UPLURAL_TYPE_CARDINAL:
        typeKey = "locales";
        break;
    case UPLURAL_TYPE_ORDINAL:
        typeKey = "locales_ordinals";
        break;
    default:
        // Must not occur: The caller should have checked for valid types.
        errCode = U_ILLEGAL_ARGUMENT_ERROR;
        return emptyStr;
    }
    LocalUResourceBundlePointer locRes(ures_getByKey(rb.getAlias(), typeKey, nullptr, &errCode));
    if(U_FAILURE(errCode)) {
        return emptyStr;
    }
    int32_t resLen=0;
    const char *curLocaleName=locale.getName();
    const UChar* s = ures_getStringByKey(locRes.getAlias(), curLocaleName, &resLen, &errCode);

    if (s == nullptr) {
        // Check parent locales.
        UErrorCode status = U_ZERO_ERROR;
        char parentLocaleName[ULOC_FULLNAME_CAPACITY];
        const char *curLocaleName2=locale.getName();
        uprv_strcpy(parentLocaleName, curLocaleName2);

        while (uloc_getParent(parentLocaleName, parentLocaleName,
                                       ULOC_FULLNAME_CAPACITY, &status) > 0) {
            resLen=0;
            s = ures_getStringByKey(locRes.getAlias(), parentLocaleName, &resLen, &status);
            if (s != nullptr) {
                errCode = U_ZERO_ERROR;
                break;
            }
            status = U_ZERO_ERROR;
        }
    }
    if (s==nullptr) {
        return emptyStr;
    }

    char setKey[256];
    u_UCharsToChars(s, setKey, resLen + 1);
    // printf("\n PluralRule: %s\n", setKey);

    LocalUResourceBundlePointer ruleRes(ures_getByKey(rb.getAlias(), "rules", nullptr, &errCode));
    if(U_FAILURE(errCode)) {
        return emptyStr;
    }
    LocalUResourceBundlePointer setRes(ures_getByKey(ruleRes.getAlias(), setKey, nullptr, &errCode));
    if (U_FAILURE(errCode)) {
        return emptyStr;
    }

    int32_t numberKeys = ures_getSize(setRes.getAlias());
    UnicodeString result;
    const char *key=nullptr;
    for(int32_t i=0; i<numberKeys; ++i) {   // Keys are zero, one, few, ...
        UnicodeString rules = ures_getNextUnicodeString(setRes.getAlias(), &key, &errCode);
        UnicodeString uKey(key, -1, US_INV);
        result.append(uKey);
        result.append(COLON);
        result.append(rules);
        result.append(SEMI_COLON);
    }
    return result;
}